

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O2

void sam_hdr_free(SAM_hdr *hdr)

{
  int iVar1;
  long lVar2;
  int i;
  long lVar3;
  
  if ((hdr != (SAM_hdr *)0x0) && (iVar1 = hdr->ref_count, hdr->ref_count = iVar1 + -1, iVar1 < 2)) {
    free((hdr->text).s);
    if (hdr->h != (kh_sam_hdr_t *)0x0) {
      kh_destroy_sam_hdr(hdr->h);
    }
    if (hdr->ref_hash != (kh_m_s2i_t *)0x0) {
      kh_destroy_m_s2i(hdr->ref_hash);
    }
    if (hdr->ref != (SAM_SQ *)0x0) {
      lVar2 = 0;
      for (lVar3 = 0; lVar3 < hdr->nref; lVar3 = lVar3 + 1) {
        free(*(void **)((long)&hdr->ref->name + lVar2));
        lVar2 = lVar2 + 0x20;
      }
      free(hdr->ref);
    }
    if (hdr->rg_hash != (kh_m_s2i_t *)0x0) {
      kh_destroy_m_s2i(hdr->rg_hash);
    }
    if (hdr->rg != (SAM_RG *)0x0) {
      lVar2 = 0;
      for (lVar3 = 0; lVar3 < hdr->nrg; lVar3 = lVar3 + 1) {
        free(*(void **)((long)&hdr->rg->name + lVar2));
        lVar2 = lVar2 + 0x20;
      }
      free(hdr->rg);
    }
    if (hdr->pg_hash != (kh_m_s2i_t *)0x0) {
      kh_destroy_m_s2i(hdr->pg_hash);
    }
    if (hdr->pg != (SAM_PG *)0x0) {
      lVar2 = 0;
      for (lVar3 = 0; lVar3 < hdr->npg; lVar3 = lVar3 + 1) {
        free(*(void **)((long)&hdr->pg->name + lVar2));
        lVar2 = lVar2 + 0x28;
      }
      free(hdr->pg);
    }
    free(hdr->pg_end);
    if (hdr->type_pool != (pool_alloc_t *)0x0) {
      pool_destroy(hdr->type_pool);
    }
    if (hdr->tag_pool != (pool_alloc_t *)0x0) {
      pool_destroy(hdr->tag_pool);
    }
    if (hdr->str_pool != (string_alloc_t *)0x0) {
      string_pool_destroy(hdr->str_pool);
    }
    free(hdr);
    return;
  }
  return;
}

Assistant:

void sam_hdr_free(SAM_hdr *hdr) {
    if (!hdr)
	return;

    if (--hdr->ref_count > 0)
	return;

    if (ks_str(&hdr->text))
	KS_FREE(&hdr->text);

    if (hdr->h)
	kh_destroy(sam_hdr, hdr->h);

    if (hdr->ref_hash)
	kh_destroy(m_s2i, hdr->ref_hash);

    if (hdr->ref) {
	int i;
	for (i = 0; i < hdr->nref; i++)
	    if (hdr->ref[i].name)
		free(hdr->ref[i].name);
	free(hdr->ref);
    }

    if (hdr->rg_hash)
	kh_destroy(m_s2i, hdr->rg_hash);

    if (hdr->rg) {
	int i;
	for (i = 0; i < hdr->nrg; i++)
	    if (hdr->rg[i].name)
		free(hdr->rg[i].name);
	free(hdr->rg);
    }

    if (hdr->pg_hash)
	kh_destroy(m_s2i, hdr->pg_hash);

    if (hdr->pg) {
	int i;
	for (i = 0; i < hdr->npg; i++)
	    if (hdr->pg[i].name)
		free(hdr->pg[i].name);
	free(hdr->pg);
    }

    if (hdr->pg_end)
	free(hdr->pg_end);

    if (hdr->type_pool)
	pool_destroy(hdr->type_pool);

    if (hdr->tag_pool)
	pool_destroy(hdr->tag_pool);

    if (hdr->str_pool)
	string_pool_destroy(hdr->str_pool);

    free(hdr);
}